

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

cmSourceFile * __thiscall
cmGeneratorTarget::GetModuleDefinitionFile(cmGeneratorTarget *this,string *config)

{
  cmSourceFile *pcVar1;
  pointer ppcVar2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> data;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sourceFiles;
  TagVisitor<ModuleDefinitionFileTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  visitor;
  _Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_158;
  _Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_138;
  TagVisitor<ModuleDefinitionFileTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_118;
  
  local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetSourceFiles(this,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_138,config);
  TagVisitor<ModuleDefinitionFileTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  ::TagVisitor(&local_118,this,
               (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&local_158);
  for (ppcVar2 = local_138._M_impl.super__Vector_impl_data._M_start;
      ppcVar2 != local_138._M_impl.super__Vector_impl_data._M_finish; ppcVar2 = ppcVar2 + 1) {
    TagVisitor<ModuleDefinitionFileTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::Accept(&local_118,*ppcVar2);
  }
  TagVisitor<ModuleDefinitionFileTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  ::~TagVisitor(&local_118);
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base(&local_138);
  if (local_158._M_impl.super__Vector_impl_data._M_start ==
      local_158._M_impl.super__Vector_impl_data._M_finish) {
    pcVar1 = (cmSourceFile *)0x0;
  }
  else {
    pcVar1 = *local_158._M_impl.super__Vector_impl_data._M_start;
  }
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&local_158);
  return pcVar1;
}

Assistant:

cmSourceFile const*
cmGeneratorTarget::GetModuleDefinitionFile(const std::string& config) const
{
  std::vector<cmSourceFile const*> data;
  IMPLEMENT_VISIT_IMPL(ModuleDefinitionFile,
                       COMMA std::vector<cmSourceFile const*>)
  if(!data.empty())
    {
    return data.front();
    }

  return 0;
}